

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::CreateSynchStateController
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CObjectType *potObjectType,
          VOID *pvSynchData,ObjectDomain odObjectDomain,ISynchStateController **ppStateController)

{
  WaitDomain wdWaitDomain_00;
  CSynchStateController *pobj;
  CSynchData *local_68;
  CSynchData *psdSynchData;
  WaitDomain wdWaitDomain;
  CSynchStateController *pCtrlr;
  PAL_ERROR palErr;
  ISynchStateController **ppStateController_local;
  ObjectDomain odObjectDomain_local;
  VOID *pvSynchData_local;
  CObjectType *potObjectType_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  pCtrlr._4_4_ = 0;
  wdWaitDomain_00 = LocalWait;
  local_68 = (CSynchData *)pvSynchData;
  if (odObjectDomain == SharedObject) {
    wdWaitDomain_00 = SharedWait;
    local_68 = (CSynchData *)SHMPtrToPtr((SHMPTR)pvSynchData);
  }
  pobj = CSynchCache<CorUnix::CSynchStateController>::Get(&this->m_cacheStateCtrlrs,pthrCurrent);
  if (pobj == (CSynchStateController *)0x0) {
    pCtrlr._4_4_ = 8;
  }
  else {
    CSynchControllerBase::Init
              (&pobj->super_CSynchControllerBase,pthrCurrent,StateController,odObjectDomain,
               potObjectType,local_68,wdWaitDomain_00);
    *ppStateController = &pobj->super_ISynchStateController;
  }
  if ((pCtrlr._4_4_ != 0) && (pobj != (CSynchStateController *)0x0)) {
    CSynchCache<CorUnix::CSynchStateController>::Add(&this->m_cacheStateCtrlrs,pthrCurrent,pobj);
  }
  return pCtrlr._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::CreateSynchStateController(
        CPalThread *pthrCurrent,
        CObjectType *potObjectType,
        VOID *pvSynchData,
        ObjectDomain odObjectDomain,
        ISynchStateController **ppStateController)
    {
        PAL_ERROR palErr = NO_ERROR;
        CSynchStateController * pCtrlr =  NULL;
        WaitDomain wdWaitDomain = (SharedObject == odObjectDomain) ? SharedWait : LocalWait;
        CSynchData * psdSynchData;

        psdSynchData = (SharedObject == odObjectDomain) ? SharedIDToTypePointer(
            CSynchData, reinterpret_cast<SharedID>(pvSynchData)) :
            static_cast<CSynchData *>(pvSynchData);

        VALIDATEOBJECT(psdSynchData);

        pCtrlr = m_cacheStateCtrlrs.Get(pthrCurrent);
        if (NULL == pCtrlr)
        {
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto CSSC_exit;
        }

        pCtrlr->Init(pthrCurrent,
                     CSynchControllerBase::StateController,
                     odObjectDomain,
                     potObjectType,
                     psdSynchData,
                     wdWaitDomain);

        // Succeeded
        *ppStateController = (ISynchStateController *)pCtrlr;

    CSSC_exit:
        if ((NO_ERROR != palErr) && (NULL != pCtrlr))
        {
            m_cacheStateCtrlrs.Add(pthrCurrent, pCtrlr);
        }
        return palErr;
    }